

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# xmlparse.c
# Opt level: O0

XML_Error handleUnknownEncoding(XML_Parser parser,XML_Char *encodingName)

{
  char *pcVar1;
  int iVar2;
  undefined8 uVar3;
  code *pcVar4;
  long lVar5;
  ENCODING *enc;
  char local_438 [4];
  int i;
  XML_Encoding info;
  XML_Char *encodingName_local;
  XML_Parser parser_local;
  
  if (*(long *)((long)parser + 0xf0) != 0) {
    for (enc._4_4_ = 0; enc._4_4_ < 0x100; enc._4_4_ = enc._4_4_ + 1) {
      pcVar1 = local_438 + (long)enc._4_4_ * 4;
      pcVar1[0] = -1;
      pcVar1[1] = -1;
      pcVar1[2] = -1;
      pcVar1[3] = -1;
    }
    info.data = (void *)0x0;
    info.map[0xfe] = 0;
    info.map[0xff] = 0;
    info.convert = (_func_int_void_ptr_char_ptr *)0x0;
    info.release = (_func_void_void_ptr *)encodingName;
    iVar2 = (**(code **)((long)parser + 0xf0))
                      (*(undefined8 *)((long)parser + 0x1e0),encodingName,local_438);
    if (iVar2 != 0) {
      pcVar4 = *(code **)((long)parser + 0x18);
      iVar2 = cm_expat_XmlSizeOfUnknownEncoding();
      uVar3 = (*pcVar4)((long)iVar2);
      *(undefined8 *)((long)parser + 0x1d0) = uVar3;
      if (*(long *)((long)parser + 0x1d0) == 0) {
        if (info.convert != (_func_int_void_ptr_char_ptr *)0x0) {
          (*info.convert)((void *)info.map._1016_8_,encodingName);
        }
        return XML_ERROR_NO_MEMORY;
      }
      pcVar4 = cm_expat_XmlInitUnknownEncoding;
      if (*(int *)((long)parser + 0x1c8) != 0) {
        pcVar4 = cm_expat_XmlInitUnknownEncodingNS;
      }
      encodingName = local_438;
      lVar5 = (*pcVar4)(*(undefined8 *)((long)parser + 0x1d0),encodingName,info.data,
                        info.map._1016_8_);
      if (lVar5 != 0) {
        *(undefined8 *)((long)parser + 0x1d8) = info.map._1016_8_;
        *(_func_int_void_ptr_char_ptr **)((long)parser + 0x1e8) = info.convert;
        *(long *)((long)parser + 0x118) = lVar5;
        return XML_ERROR_NONE;
      }
    }
    if (info.convert != (_func_int_void_ptr_char_ptr *)0x0) {
      (*info.convert)((void *)info.map._1016_8_,encodingName);
    }
  }
  return XML_ERROR_UNKNOWN_ENCODING;
}

Assistant:

static enum XML_Error
handleUnknownEncoding(XML_Parser parser, const XML_Char *encodingName)
{
  if (unknownEncodingHandler) {
    XML_Encoding info;
    int i;
    for (i = 0; i < 256; i++)
      info.map[i] = -1;
    info.convert = 0;
    info.data = 0;
    info.release = 0;
    if (unknownEncodingHandler(unknownEncodingHandlerData, encodingName, &info)) {
      ENCODING *enc;
      unknownEncodingMem = MALLOC(XmlSizeOfUnknownEncoding());
      if (!unknownEncodingMem) {
        if (info.release)
          info.release(info.data);
        return XML_ERROR_NO_MEMORY;
      }
      enc = (ns
             ? XmlInitUnknownEncodingNS
             : XmlInitUnknownEncoding)(unknownEncodingMem,
                                       info.map,
                                       info.convert,
                                       info.data);
      if (enc) {
        unknownEncodingData = info.data;
        unknownEncodingRelease = info.release;
        encoding = enc;
        return XML_ERROR_NONE;
      }
    }
    if (info.release)
      info.release(info.data);
  }
  return XML_ERROR_UNKNOWN_ENCODING;
}